

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

char * TagToString(Node *tag,char *buf,size_t count)

{
  Bool BVar1;
  uint uVar2;
  ctmbstr ptVar3;
  size_t count_local;
  char *buf_local;
  Node *tag_local;
  
  *buf = '\0';
  if (tag != (Node *)0x0) {
    BVar1 = prvTidynodeIsElement(tag);
    if (BVar1 == no) {
      if (tag->type == EndTag) {
        prvTidytmbsnprintf(buf,count,"</%s>",tag->element);
      }
      else if (tag->type == DocTypeTag) {
        prvTidytmbsnprintf(buf,count,"<!DOCTYPE>");
      }
      else if (tag->type == TextNode) {
        ptVar3 = tidyLocalizedString(0x810);
        prvTidytmbsnprintf(buf,count,"%s",ptVar3);
      }
      else if (tag->type == XmlDecl) {
        ptVar3 = tidyLocalizedString(0x816);
        prvTidytmbsnprintf(buf,count,"%s",ptVar3);
      }
      else if (tag->element != (tmbstr)0x0) {
        prvTidytmbsnprintf(buf,count,"%s",tag->element);
      }
    }
    else {
      prvTidytmbsnprintf(buf,count,"<%s>",tag->element);
    }
  }
  uVar2 = prvTidytmbstrlen(buf);
  return buf + uVar2;
}

Assistant:

static char* TagToString(Node* tag, char* buf, size_t count)
{
    *buf = 0;
    if (tag)
    {
        if (TY_(nodeIsElement)(tag))
            TY_(tmbsnprintf)(buf, count, "<%s>", tag->element);
        else if (tag->type == EndTag)
            TY_(tmbsnprintf)(buf, count, "</%s>", tag->element);
        else if (tag->type == DocTypeTag)
            TY_(tmbsnprintf)(buf, count, "<!DOCTYPE>");
        else if (tag->type == TextNode)
            TY_(tmbsnprintf)(buf, count, "%s", tidyLocalizedString(STRING_PLAIN_TEXT));
        else if (tag->type == XmlDecl)
            TY_(tmbsnprintf)(buf, count, "%s", tidyLocalizedString(STRING_XML_DECLARATION));
        else if (tag->element)
            TY_(tmbsnprintf)(buf, count, "%s", tag->element);
    }
    return buf + TY_(tmbstrlen)(buf);
}